

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitAtomicRMW(PrintExpressionContents *this,AtomicRMW *curr)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  address64_t aVar4;
  ostream *this_00;
  Module *in_R8;
  bool bVar5;
  Name name;
  BasicType local_24;
  uintptr_t local_20;
  AtomicRMW *local_18;
  AtomicRMW *curr_local;
  PrintExpressionContents *this_local;
  
  local_18 = curr;
  curr_local = (AtomicRMW *)this;
  prepareColor(this->o);
  local_20 = (local_18->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.type.id
  ;
  printRMWSize(this->o,(Type)local_20,local_18->bytes);
  printAtomicRMWOp(this,local_18->op);
  local_24 = unreachable;
  bVar2 = wasm::Type::operator!=
                    (&(local_18->super_SpecificExpression<(wasm::Expression::Id)24>).
                      super_Expression.type,&local_24);
  bVar5 = false;
  if (bVar2) {
    bVar1 = local_18->bytes;
    uVar3 = wasm::Type::getByteSize
                      (&(local_18->super_SpecificExpression<(wasm::Expression::Id)24>).
                        super_Expression.type);
    bVar5 = bVar1 != uVar3;
  }
  if (bVar5) {
    std::operator<<(this->o,"_u");
  }
  restoreNormalColor(this->o);
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = (size_t)(local_18->memory).super_IString.str._M_str;
  anon_unknown_0::printMemoryName
            ((anon_unknown_0 *)(local_18->memory).super_IString.str._M_len,name,
             (ostream *)this->wasm,in_R8);
  aVar4 = wasm::Address::operator_cast_to_unsigned_long(&local_18->offset);
  if (aVar4 != 0) {
    this_00 = std::operator<<(this->o," offset=");
    aVar4 = wasm::Address::operator_cast_to_unsigned_long(&local_18->offset);
    std::ostream::operator<<(this_00,aVar4);
  }
  return;
}

Assistant:

void visitAtomicRMW(AtomicRMW* curr) {
    prepareColor(o);
    printRMWSize(o, curr->type, curr->bytes);
    printAtomicRMWOp(curr->op);
    if (curr->type != Type::unreachable &&
        curr->bytes != curr->type.getByteSize()) {
      o << "_u";
    }
    restoreNormalColor(o);
    printMemoryName(curr->memory, o, wasm);
    if (curr->offset) {
      o << " offset=" << curr->offset;
    }
  }